

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

int __thiscall
vkt::QueryPool::QueryPoolStatisticsTests::init(QueryPoolStatisticsTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  TestNode *this_00;
  TestNode *this_01;
  TestNode *this_02;
  TestNode *this_03;
  TestNode *this_04;
  TestNode *this_05;
  TestNode *this_06;
  TestNode *this_07;
  TestNode *this_08;
  TestNode *this_09;
  TestNode *pTVar1;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
  *pQVar2;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
  *pQVar3;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
  *pQVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
  *pQVar7;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
  *pQVar8;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
  *pQVar9;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  *pQVar10;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  *pQVar11;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  *pQVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar13;
  long lVar14;
  char *pcVar15;
  long *plVar16;
  ParametersGraphic in_R8;
  long lVar17;
  size_type __dnew;
  string topology_name [11];
  ostringstream shaderName;
  value_type local_3a8;
  TestNode *local_370;
  undefined8 local_368;
  uint auStack_360 [10];
  undefined8 local_338;
  uint auStack_330 [10];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  long *local_1c8 [2];
  long local_1b8 [2];
  uint **local_1a8;
  uint *local_1a0;
  uint *local_198;
  undefined2 local_190;
  ios_base local_138 [264];
  
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"point_list","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"line_list","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"line_strip","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"triangle_list","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"triangle_strip","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"triangle_fan","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"line_list_with_adjacency","")
  ;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"line_strip_with_adjacency","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,"triangle_list_with_adjacency","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"triangle_strip_with_adjacency","");
  plVar16 = local_1b8;
  local_1c8[0] = plVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"patch_list","");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "compute_shader_invocations","Query pipeline statistic compute shader invocations");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_01,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "input_assembly_vertices","Query pipeline statistic input assembly vertices");
  this_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_02,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "input_assembly_primitives","Query pipeline statistic input assembly primitives");
  this_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_03,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "vertex_shader_invocations","Query pipeline statistic vertex shader invocation");
  this_04 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_04,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "fragment_shader_invocations","Query pipeline statistic fragment shader invocation");
  this_05 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_05,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "geometry_shader_invocations","Query pipeline statistic geometry shader invocation");
  this_06 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_06,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "geometry_shader_primitives","Query pipeline statistic geometry shader primitives");
  this_07 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_07,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "clipping_invocations","Query pipeline statistic clipping invocations");
  this_08 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_08,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "clipping_primitives","Query pipeline statistic clipping primitives");
  this_09 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_09,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_control_patches","Query pipeline statistic tessellation control shader patches");
  local_370 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_370,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations",
             "Query pipeline statistic tessellation evaluation shader invocations");
  pTVar1 = (TestNode *)operator_new(0x88);
  local_1a0 = (uint *)0x7;
  local_198 = (uint *)0x7972616d697270;
  pcVar15 = (char *)((long)&local_3a8 + 0x10);
  local_3a8.localSize.m_data[2] = 0;
  local_3a8.groupSize.m_data[0] = 0;
  local_3a8.groupSize.m_data[1] = local_3a8.groupSize.m_data[1] & 0xffffff00;
  local_3a8.localSize.m_data._0_8_ = pcVar15;
  local_1a8 = &local_198;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             (char *)&local_198,pcVar15);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cec1f0;
  if ((char *)local_3a8.localSize.m_data._0_8_ != pcVar15) {
    operator_delete((void *)local_3a8.localSize.m_data._0_8_,
                    CONCAT44(local_3a8.groupSize.m_data[2],local_3a8.groupSize.m_data[1]) + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,(long)local_198 + 1);
  }
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__QueryPoolStatisticsTest_00cfba98;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  local_338 = 0x200000002;
  auStack_330[0] = 2;
  auStack_330[1] = 1;
  auStack_330[2] = 1;
  auStack_330[3] = 1;
  auStack_330[4] = 3;
  auStack_330[5] = 7;
  auStack_330[6] = 3;
  local_368 = 0x200000002;
  auStack_360[0] = 2;
  auStack_360[1] = 3;
  auStack_360[2] = 7;
  auStack_360[3] = 3;
  auStack_360[4] = 1;
  auStack_360[5] = 1;
  auStack_360[6] = 1;
  lVar17 = 0;
  lVar14 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"compute_",8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar14);
    local_3a8.localSize.m_data[2] = *(uint *)((long)auStack_330 + lVar17);
    local_3a8.localSize.m_data._0_8_ = *(undefined8 *)((long)&local_338 + lVar17);
    local_3a8.groupSize.m_data[2] = *(uint *)((long)auStack_360 + lVar17);
    local_3a8.groupSize.m_data[0] = (uint)*(undefined8 *)((long)&local_368 + lVar17);
    local_3a8.groupSize.m_data[1] =
         (uint)((ulong)*(undefined8 *)((long)&local_368 + lVar17) >> 0x20);
    std::__cxx11::stringbuf::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back((vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 *)(pTVar1 + 1),&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.shaderName._M_dataplus._M_p != &local_3a8.shaderName.field_2) {
      operator_delete(local_3a8.shaderName._M_dataplus._M_p,
                      local_3a8.shaderName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar14 = lVar14 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar14 != 3);
  tcu::TestNode::addChild(this_00,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  local_198 = (uint *)0x7261646e6f636573;
  local_190 = 0x79;
  local_1a0 = (uint *)0x9;
  pcVar15 = (char *)((long)&local_3a8 + 0x10);
  local_3a8.localSize.m_data[2] = 0;
  local_3a8.groupSize.m_data[0] = 0;
  local_3a8.groupSize.m_data[1] = local_3a8.groupSize.m_data[1] & 0xffffff00;
  local_3a8.localSize.m_data._0_8_ = pcVar15;
  local_1a8 = &local_198;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             (char *)&local_198,pcVar15);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cec1f0;
  if ((char *)local_3a8.localSize.m_data._0_8_ != pcVar15) {
    operator_delete((void *)local_3a8.localSize.m_data._0_8_,
                    CONCAT44(local_3a8.groupSize.m_data[2],local_3a8.groupSize.m_data[1]) + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,(long)local_198 + 1);
  }
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__QueryPoolStatisticsTest_00cfbb60;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  local_338 = 0x200000002;
  auStack_330[0] = 2;
  auStack_330[1] = 1;
  auStack_330[2] = 1;
  auStack_330[3] = 1;
  auStack_330[4] = 3;
  auStack_330[5] = 7;
  auStack_330[6] = 3;
  local_368 = 0x200000002;
  auStack_360[0] = 2;
  auStack_360[1] = 3;
  auStack_360[2] = 7;
  auStack_360[3] = 3;
  auStack_360[4] = 1;
  auStack_360[5] = 1;
  auStack_360[6] = 1;
  lVar17 = 0;
  lVar14 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"compute_",8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar14);
    local_3a8.localSize.m_data[2] = *(uint *)((long)auStack_330 + lVar17);
    local_3a8.localSize.m_data._0_8_ = *(undefined8 *)((long)&local_338 + lVar17);
    local_3a8.groupSize.m_data[2] = *(uint *)((long)auStack_360 + lVar17);
    local_3a8.groupSize.m_data[0] = (uint)*(undefined8 *)((long)&local_368 + lVar17);
    local_3a8.groupSize.m_data[1] =
         (uint)((ulong)*(undefined8 *)((long)&local_368 + lVar17) >> 0x20);
    std::__cxx11::stringbuf::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back((vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 *)(pTVar1 + 1),&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.shaderName._M_dataplus._M_p != &local_3a8.shaderName.field_2) {
      operator_delete(local_3a8.shaderName._M_dataplus._M_p,
                      local_3a8.shaderName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar14 = lVar14 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar14 != 3);
  tcu::TestNode::addChild(this_00,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  testCtx = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_3a8.localSize.m_data._0_8_ = (uint *)0x13;
  local_1a8 = &local_198;
  local_1a8 = (uint **)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_3a8);
  local_198 = (uint *)local_3a8.localSize.m_data._0_8_;
  *local_1a8 = (uint *)0x7261646e6f636573;
  local_1a8[1] = (uint *)0x697265686e695f79;
  builtin_strncpy((char *)((long)local_1a8 + 0xf),"ited",4);
  local_1a0 = (uint *)local_3a8.localSize.m_data._0_8_;
  *(char *)((long)local_1a8 + local_3a8.localSize.m_data._0_8_) = '\0';
  pcVar15 = (char *)((long)&local_3a8 + 0x10);
  local_3a8.localSize.m_data[2] = 0;
  local_3a8.groupSize.m_data[0] = 0;
  local_3a8.groupSize.m_data[1] = local_3a8.groupSize.m_data[1] & 0xffffff00;
  local_3a8.localSize.m_data._0_8_ = pcVar15;
  tcu::TestCase::TestCase((TestCase *)pTVar1,testCtx,(char *)local_1a8,pcVar15);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cec1f0;
  if ((char *)local_3a8.localSize.m_data._0_8_ != pcVar15) {
    operator_delete((void *)local_3a8.localSize.m_data._0_8_,
                    CONCAT44(local_3a8.groupSize.m_data[2],local_3a8.groupSize.m_data[1]) + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,(long)local_198 + 1);
  }
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__QueryPoolStatisticsTest_00cfbc18;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  local_338 = 0x200000002;
  auStack_330[0] = 2;
  auStack_330[1] = 1;
  auStack_330[2] = 1;
  auStack_330[3] = 1;
  auStack_330[4] = 3;
  auStack_330[5] = 7;
  auStack_330[6] = 3;
  local_368 = 0x200000002;
  auStack_360[0] = 2;
  auStack_360[1] = 3;
  auStack_360[2] = 7;
  auStack_360[3] = 3;
  auStack_360[4] = 1;
  auStack_360[5] = 1;
  auStack_360[6] = 1;
  lVar17 = 0;
  lVar14 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"compute_",8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar14);
    local_3a8.localSize.m_data[2] = *(uint *)((long)auStack_330 + lVar17);
    local_3a8.localSize.m_data._0_8_ = *(undefined8 *)((long)&local_338 + lVar17);
    local_3a8.groupSize.m_data[2] = *(uint *)((long)auStack_360 + lVar17);
    local_3a8.groupSize.m_data[0] = (uint)*(undefined8 *)((long)&local_368 + lVar17);
    local_3a8.groupSize.m_data[1] =
         (uint)((ulong)*(undefined8 *)((long)&local_368 + lVar17) >> 0x20);
    std::__cxx11::stringbuf::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back((vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 *)(pTVar1 + 1),&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.shaderName._M_dataplus._M_p != &local_3a8.shaderName.field_2) {
      operator_delete(local_3a8.shaderName._M_dataplus._M_p,
                      local_3a8.shaderName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar14 = lVar14 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar14 != 3);
  tcu::TestNode::addChild(this_00,pTVar1);
  pQVar2 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
            *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>::
  QueryPoolGraphicStatisticsTest
            (pQVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             (char *)0x400000001,in_R8);
  tcu::TestNode::addChild(this_01,(TestNode *)pQVar2);
  pQVar3 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
            *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary",
             (char *)0x400000001,in_R8);
  tcu::TestNode::addChild(this_01,(TestNode *)pQVar3);
  pQVar4 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
            *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited",
             (char *)0x400000001,in_R8);
  tcu::TestNode::addChild(this_01,(TestNode *)pQVar4);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = (char *)0x2;
  lVar14 = 0;
  do {
    pQVar2 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar2);
    pQVar3 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar3);
    pQVar4 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar4);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_02,pTVar1);
  tcu::TestNode::addChild(this_02,pTVar5);
  tcu::TestNode::addChild(this_02,pTVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = (char *)0x4;
  lVar14 = 0;
  do {
    pQVar2 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar2);
    pQVar3 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar3);
    pQVar4 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar4);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_03,pTVar1);
  tcu::TestNode::addChild(this_03,pTVar5);
  tcu::TestNode::addChild(this_03,pTVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = (char *)0x80;
  lVar14 = 0;
  do {
    pQVar2 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar2);
    pQVar3 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar3);
    pQVar4 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar4);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_04,pTVar1);
  tcu::TestNode::addChild(this_04,pTVar5);
  tcu::TestNode::addChild(this_04,pTVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = (char *)0x8;
  lVar14 = 0;
  do {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar7);
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar8);
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar9);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_05,pTVar1);
  tcu::TestNode::addChild(this_05,pTVar5);
  tcu::TestNode::addChild(this_05,pTVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = &DAT_00000010;
  lVar14 = 0;
  do {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar7);
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar8);
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar9);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_06,pTVar1);
  tcu::TestNode::addChild(this_06,pTVar5);
  tcu::TestNode::addChild(this_06,pTVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = (char *)0x20;
  lVar14 = 0;
  do {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar7);
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar8);
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar9);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_07,pTVar1);
  tcu::TestNode::addChild(this_07,pTVar5);
  tcu::TestNode::addChild(this_07,pTVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary","");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "secondary_inherited","");
  pcVar15 = (char *)0x40;
  lVar14 = 0;
  do {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pQVar7);
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pQVar8);
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)local_308 + lVar14),pcVar15,in_R8);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pQVar9);
    lVar14 = lVar14 + 0x20;
    pcVar15 = pcVar15 + 0x100000000;
  } while (lVar14 != 0x140);
  tcu::TestNode::addChild(this_08,pTVar1);
  tcu::TestNode::addChild(this_08,pTVar5);
  tcu::TestNode::addChild(this_08,pTVar6);
  pQVar10 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"tes_control_patches",
             (char *)0x400000100,in_R8);
  tcu::TestNode::addChild(this_09,(TestNode *)pQVar10);
  pQVar11 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar11,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_control_patches_secondary",(char *)0x400000100,in_R8);
  tcu::TestNode::addChild(this_09,(TestNode *)pQVar11);
  pQVar12 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_control_patches_secondary_inherited",(char *)0x400000100,in_R8);
  tcu::TestNode::addChild(this_09,(TestNode *)pQVar12);
  pQVar10 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations",(char *)0x400000200,in_R8);
  tcu::TestNode::addChild(local_370,(TestNode *)pQVar10);
  pQVar11 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar11,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations_secondary",(char *)0x400000200,in_R8);
  tcu::TestNode::addChild(local_370,(TestNode *)pQVar11);
  pQVar12 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations_secondary_inherited",(char *)0x400000200,in_R8);
  tcu::TestNode::addChild(local_370,(TestNode *)pQVar12);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  tcu::TestNode::addChild((TestNode *)this,this_01);
  tcu::TestNode::addChild((TestNode *)this,this_02);
  tcu::TestNode::addChild((TestNode *)this,this_03);
  tcu::TestNode::addChild((TestNode *)this,this_04);
  tcu::TestNode::addChild((TestNode *)this,this_05);
  tcu::TestNode::addChild((TestNode *)this,this_06);
  tcu::TestNode::addChild((TestNode *)this,this_07);
  tcu::TestNode::addChild((TestNode *)this,this_08);
  tcu::TestNode::addChild((TestNode *)this,this_09);
  tcu::TestNode::addChild((TestNode *)this,local_370);
  lVar14 = -0x160;
  uVar13 = extraout_RAX;
  do {
    if (plVar16 != (long *)plVar16[-2]) {
      operator_delete((long *)plVar16[-2],*plVar16 + 1);
      uVar13 = extraout_RAX_00;
    }
    plVar16 = plVar16 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  return (int)uVar13;
}

Assistant:

void QueryPoolStatisticsTests::init (void)
{
	std::string topology_name [VK_PRIMITIVE_TOPOLOGY_LAST] =
	{
		"point_list",
		"line_list",
		"line_strip",
		"triangle_list",
		"triangle_strip",
		"triangle_fan",
		"line_list_with_adjacency",
		"line_strip_with_adjacency",
		"triangle_list_with_adjacency",
		"triangle_strip_with_adjacency",
		"patch_list"
	};

	de::MovePtr<TestCaseGroup>	computeShaderInvocationsGroup		(new TestCaseGroup(m_testCtx, "compute_shader_invocations",			"Query pipeline statistic compute shader invocations"));
	de::MovePtr<TestCaseGroup>	inputAssemblyVertices				(new TestCaseGroup(m_testCtx, "input_assembly_vertices",			"Query pipeline statistic input assembly vertices"));
	de::MovePtr<TestCaseGroup>	inputAssemblyPrimitives				(new TestCaseGroup(m_testCtx, "input_assembly_primitives",			"Query pipeline statistic input assembly primitives"));
	de::MovePtr<TestCaseGroup>	vertexShaderInvocations				(new TestCaseGroup(m_testCtx, "vertex_shader_invocations",			"Query pipeline statistic vertex shader invocation"));
	de::MovePtr<TestCaseGroup>	fragmentShaderInvocations			(new TestCaseGroup(m_testCtx, "fragment_shader_invocations",		"Query pipeline statistic fragment shader invocation"));
	de::MovePtr<TestCaseGroup>	geometryShaderInvocations			(new TestCaseGroup(m_testCtx, "geometry_shader_invocations",		"Query pipeline statistic geometry shader invocation"));
	de::MovePtr<TestCaseGroup>	geometryShaderPrimitives			(new TestCaseGroup(m_testCtx, "geometry_shader_primitives",			"Query pipeline statistic geometry shader primitives"));
	de::MovePtr<TestCaseGroup>	clippingInvocations					(new TestCaseGroup(m_testCtx, "clipping_invocations",				"Query pipeline statistic clipping invocations"));
	de::MovePtr<TestCaseGroup>	clippingPrimitives					(new TestCaseGroup(m_testCtx, "clipping_primitives",				"Query pipeline statistic clipping primitives"));
	de::MovePtr<TestCaseGroup>	tesControlPatches					(new TestCaseGroup(m_testCtx, "tes_control_patches",				"Query pipeline statistic tessellation control shader patches"));
	de::MovePtr<TestCaseGroup>	tesEvaluationShaderInvocations		(new TestCaseGroup(m_testCtx, "tes_evaluation_shader_invocations",	"Query pipeline statistic tessellation evaluation shader invocations"));

	computeShaderInvocationsGroup->addChild(new QueryPoolStatisticsTest<ComputeInvocationsTestInstance>						(m_testCtx, "primary",				""));
	computeShaderInvocationsGroup->addChild(new QueryPoolStatisticsTest<ComputeInvocationsSecondaryTestInstance>			(m_testCtx, "secondary",			""));
	computeShaderInvocationsGroup->addChild(new QueryPoolStatisticsTest<ComputeInvocationsSecondaryInheritedTestInstance>	(m_testCtx, "secondary_inherited",	""));

	//VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT
	inputAssemblyVertices->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	"primary",				"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	inputAssemblyVertices->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	"secondary",			"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	inputAssemblyVertices->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	"secondary_inherited",	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));

	//VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		inputAssemblyPrimitives->addChild(primary.release());
		inputAssemblyPrimitives->addChild(secondary.release());
		inputAssemblyPrimitives->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		vertexShaderInvocations->addChild(primary.release());
		vertexShaderInvocations->addChild(secondary.release());
		vertexShaderInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		fragmentShaderInvocations->addChild(primary.release());
		fragmentShaderInvocations->addChild(secondary.release());
		fragmentShaderInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		geometryShaderInvocations->addChild(primary.release());
		geometryShaderInvocations->addChild(secondary.release());
		geometryShaderInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		geometryShaderPrimitives->addChild(primary.release());
		geometryShaderPrimitives->addChild(secondary.release());
		geometryShaderPrimitives->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		clippingInvocations->addChild(primary.release());
		clippingInvocations->addChild(secondary.release());
		clippingInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		clippingPrimitives->addChild(primary.release());
		clippingPrimitives->addChild(secondary.release());
		clippingPrimitives->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT
	tesControlPatches->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderTestInstance>					(m_testCtx,	"tes_control_patches",						"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesControlPatches->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayTestInstance>			(m_testCtx,	"tes_control_patches_secondary",			"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesControlPatches->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayInheritedTestInstance>(m_testCtx,	"tes_control_patches_secondary_inherited",	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));

	//VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT
	tesEvaluationShaderInvocations->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderTestInstance>					 (m_testCtx,	"tes_evaluation_shader_invocations",						"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesEvaluationShaderInvocations->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayTestInstance>		 (m_testCtx,	"tes_evaluation_shader_invocations_secondary",				"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesEvaluationShaderInvocations->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayInheritedTestInstance>(m_testCtx,	"tes_evaluation_shader_invocations_secondary_inherited",	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));

	addChild(computeShaderInvocationsGroup.release());
	addChild(inputAssemblyVertices.release());
	addChild(inputAssemblyPrimitives.release());
	addChild(vertexShaderInvocations.release());
	addChild(fragmentShaderInvocations.release());
	addChild(geometryShaderInvocations.release());
	addChild(geometryShaderPrimitives.release());
	addChild(clippingInvocations.release());
	addChild(clippingPrimitives.release());
	addChild(tesControlPatches.release());
	addChild(tesEvaluationShaderInvocations.release());
}